

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar_p.h
# Opt level: O1

void __thiscall QTabBarPrivate::makeVisible(QTabBarPrivate *this,int index)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QWidget *this_00;
  Tab **ppTVar5;
  Tab *pTVar6;
  QWidgetData *pQVar7;
  Representation RVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Representation *pRVar12;
  int iVar13;
  int iVar14;
  QRect *pQVar15;
  long lVar16;
  QRect *pQVar17;
  Representation RVar18;
  QRect QVar19;
  QRect QVar20;
  
  if (index < 0) {
    return;
  }
  if ((ulong)(this->tabList).d.size <= (ulong)(uint)index) {
    return;
  }
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  ppTVar5 = (this->tabList).d.ptr;
  pTVar6 = ppTVar5[(uint)index];
  pQVar7 = this_00->data;
  if ((this->shape - RoundedWest & 0xfffffffa) == 0) {
    pQVar15 = (QRect *)&(pTVar6->rect).y1;
    pRVar12 = &(pQVar7->crect).y2;
    pQVar17 = (QRect *)&(pQVar7->crect).y1;
    lVar16 = 0x74;
  }
  else {
    pQVar15 = &pTVar6->rect;
    pQVar17 = &pQVar7->crect;
    pRVar12 = &(pQVar7->crect).x2;
    lVar16 = 0x70;
  }
  iVar1 = this->scrollOffset;
  iVar11 = pRVar12->m_i;
  iVar10 = (pQVar17->x1).m_i;
  iVar2 = (pQVar15->x1).m_i;
  iVar14 = *(int *)((long)&(pTVar6->text).d.d + lVar16);
  iVar3 = *(int *)((long)&(ppTVar5[(this->tabList).d.size + -1]->text).d.d + lVar16);
  QVar19 = normalizedScrollRect(this,index);
  QVar20 = normalizedScrollRect(this,0);
  iVar4 = this->scrollOffset;
  RVar8 = QVar19.x2.m_i;
  iVar9 = iVar4 + RVar8.m_i;
  if (iVar3 + -1 < iVar4 + RVar8.m_i) {
    iVar9 = iVar3 + -1;
  }
  RVar18 = QVar19.x1.m_i;
  iVar13 = 0;
  if ((iVar11 - iVar10) + 1 < iVar3) {
    iVar11 = 1;
    if (1 < iVar4 + RVar18.m_i) {
      iVar11 = iVar4 + RVar18.m_i;
    }
    if (iVar2 < iVar11) {
      iVar13 = iVar2 - RVar18.m_i;
    }
    else if (iVar9 < iVar14) {
      iVar14 = iVar14 - RVar8.m_i;
      iVar13 = 0;
      if (0 < iVar14) {
        iVar13 = iVar14;
      }
    }
    else {
      iVar11 = QVar20.x2.m_i.m_i - QVar20.x1.m_i;
      if (iVar11 + iVar4 + 1 <= iVar3 + 1) goto LAB_00492e49;
      iVar10 = iVar3 - (iVar11 + 1);
      iVar11 = -1;
      if (-1 < iVar10) {
        iVar11 = iVar10;
      }
      iVar13 = iVar11 + 1;
    }
  }
  this->scrollOffset = iVar13;
LAB_00492e49:
  iVar11 = this->scrollOffset;
  QWidget::setEnabled((QWidget *)this->leftB,
                      iVar11 != -RVar18.m_i &&
                      SBORROW4(iVar11,-RVar18.m_i) == iVar11 + RVar18.m_i < 0);
  QWidget::setEnabled((QWidget *)this->rightB,this->scrollOffset < iVar3 - RVar8.m_i);
  if (iVar1 == this->scrollOffset) {
    return;
  }
  QWidget::update(this_00);
  layoutWidgets(this,0);
  return;
}

Assistant:

inline bool validIndex(int index) const { return index >= 0 && index < tabList.size(); }